

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int lws_state_notify_protocol_init
              (lws_state_manager *mgr,lws_state_notify_link *link,int current,int target)

{
  lws_context_per_thread *pt;
  long lVar1;
  
  pt = (lws_context_per_thread *)&mgr[-0xb].name;
  for (lVar1 = 0; lVar1 < *(short *)((long)&mgr[6].notify_list.tail + 2); lVar1 = lVar1 + 1) {
    lws_system_do_attach(pt);
    pt = pt + 1;
  }
  if ((target == 6) && (((ulong)mgr[6].notify_list.tail & 0x40) == 0)) {
    _lws_log(8,"%s: doing protocol init on POLICY_VALID\n","lws_state_notify_protocol_init");
    lws_protocol_init((lws_context *)&mgr[-0x12].state);
  }
  return 0;
}

Assistant:

static int
lws_state_notify_protocol_init(struct lws_state_manager *mgr,
			       struct lws_state_notify_link *link, int current,
			       int target)
{
	struct lws_context *context = lws_container_of(mgr, struct lws_context,
						       mgr_system);
	int n;

	/*
	 * Deal with any attachments that were waiting for the right state
	 * to come along
	 */

	for (n = 0; n < context->count_threads; n++)
		lws_system_do_attach(&context->pt[n]);

#if defined(LWS_WITH_SYS_DHCP_CLIENT)
	if (target == LWS_SYSTATE_DHCP) {
		/*
		 * Don't let it past here until at least one iface has been
		 * configured for operation with DHCP
		 */

		if (!lws_dhcpc_status(context, NULL))
			return 1;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS_SYS_AUTH_API_AMAZON_COM)
	/*
	 * Skip this if we are running something without the policy for it
	 */
	if (target == LWS_SYSTATE_AUTH1 &&
	    context->pss_policies &&
	    !lws_system_blob_get_size(lws_system_get_blob(context,
						          LWS_SYSBLOB_TYPE_AUTH,
						          0))) {
		lwsl_info("%s: AUTH1 state triggering api.amazon.com auth\n", __func__);
		/*
		 * Start trying to acquire it if it's not already in progress
		 * returns nonzero if we determine it's not needed
		 */
		if (!lws_ss_sys_auth_api_amazon_com(context))
			return 1;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	/*
	 * Skip this if we are running something without the policy for it
	 */
	if (target == LWS_SYSTATE_POLICY_VALID &&
	    context->pss_policies && !context->policy_updated) {
		/*
		 * Start trying to acquire it if it's not already in progress
		 * returns nonzero if we determine it's not needed
		 */
		if (!lws_ss_sys_fetch_policy(context))
			return 1;
	}
#endif

	/* protocol part */

	if (context->protocol_init_done)
		return 0;

	if (target != LWS_SYSTATE_POLICY_VALID)
		return 0;

	lwsl_info("%s: doing protocol init on POLICY_VALID\n", __func__);
	lws_protocol_init(context);

	return 0;
}